

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O2

size_t cilkos_getenv(char *value,size_t vallen,char *varname)

{
  char *pcVar1;
  rsize_t rVar2;
  undefined8 uVar3;
  
  if (value == (char *)0x0) {
    pcVar1 = "value";
    uVar3 = 0x1e3;
  }
  else {
    if (varname != (char *)0x0) {
      pcVar1 = getenv(varname);
      if (pcVar1 == (char *)0x0) {
        *value = '\0';
        rVar2 = 0;
      }
      else {
        rVar2 = strnlen_s(pcVar1,0x1000);
        if (vallen - 1 < rVar2) {
          rVar2 = rVar2 + 1;
        }
        else {
          strcpy_s(value,vallen,pcVar1);
        }
      }
      return rVar2;
    }
    pcVar1 = "varname";
    uVar3 = 0x1e4;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/os-unix.c"
                ,uVar3,pcVar1);
}

Assistant:

size_t cilkos_getenv(char* value, __STDNS size_t vallen,
                                           const char* varname)
{
    CILK_ASSERT(value);
    CILK_ASSERT(varname);

    const char* envstr = getenv(varname);
    if (envstr)
    {
        size_t len = cilk_strlen(envstr);
        if (len > vallen - 1)
            return len + 1;
        cilk_strcpy_s(value, vallen, envstr);
        return len;
    }
    else
    {
        value[0] = '\0';
        return 0;
    }
}